

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkFromDarChoices(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  void *pvVar1;
  int iVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar3;
  long lVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  Aig_Obj_t *pAVar7;
  ulong uVar8;
  Abc_Obj_t *p1;
  Abc_Ntk_t *pAVar9;
  
  if (pMan->pEquivs == (Aig_Obj_t **)0x0) {
    __assert_fail("pMan->pEquivs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x460,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  if (pMan->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x461,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pNtkOld->nBarBufs;
  Aig_ManCleanData(pMan);
  pAVar3 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar3;
  pVVar5 = pMan->vCis;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      if (pNtk->vCis->nSize <= lVar4) goto LAB_002494c7;
      *(void **)((long)pVVar5->pArray[lVar4] + 0x28) = pNtk->vCis->pArray[lVar4];
      lVar4 = lVar4 + 1;
      pVVar5 = pMan->vCis;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pMan->vObjs;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar4];
      if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002494e6;
        uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          pAVar3 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        uVar6 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar6 == 0) {
          p1 = (Abc_Obj_t *)0x0;
        }
        else {
          p1 = (Abc_Obj_t *)
               ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar6 + 0x28));
        }
        pAVar3 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar3,p1);
        *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
        if (pMan->pEquivs == (Aig_Obj_t **)0x0) {
          pAVar7 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar7 = pMan->pEquivs[*(int *)((long)pvVar1 + 0x24)];
        }
        if (pAVar7 != (Aig_Obj_t *)0x0) {
          if ((pAVar7->field_5).pData == (void *)0x0) {
            __assert_fail("pTemp->pData != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                          ,0x471,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
          }
          (pAVar3->field_5).pData = (pAVar7->field_5).pData;
        }
      }
      lVar4 = lVar4 + 1;
      pVVar5 = pMan->vObjs;
    } while (lVar4 < pVVar5->nSize);
  }
  pVVar5 = pMan->vCos;
  if (0 < pVVar5->nSize) {
    lVar4 = 0;
    do {
      if (pNtk->vCos->nSize <= lVar4) {
LAB_002494c7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (((ulong)pVVar5->pArray[lVar4] & 1) != 0) {
LAB_002494e6:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar6 = *(ulong *)((long)pVVar5->pArray[lVar4] + 8);
      uVar8 = uVar6 & 0xfffffffffffffffe;
      if (uVar8 == 0) {
        pAVar3 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Abc_Obj_t *)((ulong)((uint)uVar6 & 1) ^ *(ulong *)(uVar8 + 0x28));
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[lVar4],pAVar3);
      lVar4 = lVar4 + 1;
      pVVar5 = pMan->vCos;
    } while (lVar4 < pVVar5->nSize);
  }
  pAVar9 = pNtk;
  iVar2 = Abc_NtkCheck(pNtk);
  if (iVar2 == 0) {
    Abc_Print((int)pAVar9,"Abc_NtkFromDar(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj, * pTemp;
    int i;
    assert( pMan->pEquivs != NULL );
    assert( Aig_ManBufNum(pMan) == 0 );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManCleanData( pMan );
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // rebuild the AIG
    Aig_ManForEachNode( pMan, pObj, i )
    {
        pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( (pTemp = Aig_ObjEquiv(pMan, pObj)) )
        {
            assert( pTemp->pData != NULL );
            ((Abc_Obj_t *)pObj->pData)->pData = ((Abc_Obj_t *)pTemp->pData);
        }
    }
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );

    // verify topological order
    if ( 0 )
    {
        Abc_Obj_t * pNode;
        Abc_NtkForEachNode( pNtkNew, pNode, i )
            if ( Abc_AigNodeIsChoice( pNode ) )
            {
                int Counter = 0;
                for ( pNode = Abc_ObjEquiv(pNode); pNode; pNode = Abc_ObjEquiv(pNode) )
                    Counter++;
                printf( "%d ", Counter );
            }
        printf( "\n" );
    }
    return pNtkNew;
}